

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageStore.cpp
# Opt level: O2

void __thiscall
FIX::MessageStoreExceptionWrapper::setNextSenderMsgSeqNum
          (MessageStoreExceptionWrapper *this,SEQNUM num,bool *threw,IOException *ex)

{
  *threw = false;
  (**(code **)(**(long **)this + 0x30))();
  return;
}

Assistant:

void MessageStoreExceptionWrapper::setNextSenderMsgSeqNum(SEQNUM num, bool &threw, IOException &ex) {
  threw = false;
  try {
    m_pStore->setNextSenderMsgSeqNum(num);
  } catch (IOException &e) {
    threw = true;
    ex = e;
  }
}